

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

void extract_reference_file(char *name)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  FILE *__stream_00;
  uint uVar5;
  byte *pbVar6;
  char *extra;
  uint uVar7;
  uint uVar8;
  char buff [1024];
  
  extra = name;
  snprintf(buff,0x400,"%s/%s.uu",refdir);
  __stream = fopen(buff,"r");
  failure("Couldn\'t open reference file %s",buff);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ಁ',(uint)(__stream != (FILE *)0x0),"in != NULL",extra);
  if (__stream != (FILE *)0x0) {
    do {
      pcVar4 = fgets(buff,0x400,__stream);
      if (pcVar4 == (char *)0x0) {
        return;
      }
      iVar3 = bcmp(buff,"begin ",6);
    } while (iVar3 != 0);
    __stream_00 = fopen(name,"wb");
    while( true ) {
      pcVar4 = fgets(buff,0x400,__stream);
      if ((pcVar4 == (char *)0x0) || (iVar3 = bcmp(buff,"end",3), iVar3 == 0)) break;
      pbVar1 = (byte *)(buff + 1);
      uVar2 = (byte)buff[0] & 0x3f ^ 0x20;
      while (uVar7 = uVar2, pbVar6 = pbVar1, uVar7 != 0) {
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                         ,L'ಚ',(uint)((byte)(*pbVar6 - 0x20) < 0x41),"VALID_UUDECODE(p[0])",extra)
        ;
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                         ,L'ಛ',(uint)((byte)(pbVar6[1] - 0x20) < 0x41),"VALID_UUDECODE(p[1])",
                         extra);
        uVar5 = (pbVar6[1] & 0x3f ^ 0x20) << 0xc;
        fputc(((*pbVar6 & 0x3f ^ 0x20) << 0x12 | uVar5) >> 0x10,__stream_00);
        pbVar1 = pbVar6 + 2;
        uVar2 = 0;
        if (uVar7 != 1) {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಡ',(uint)((byte)(pbVar6[2] - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                           extra);
          uVar8 = (pbVar6[2] & 0x3f ^ 0x20) << 6;
          fputc((uVar5 | uVar8) >> 8 & 0xff,__stream_00);
          pbVar1 = pbVar6 + 3;
          if (uVar7 != 2) {
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                             ,L'ಧ',(uint)((byte)(pbVar6[3] - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                             extra);
            fputc((uVar8 & 0xff | pbVar6[3] & 0x3f) ^ 0x20,__stream_00);
            pbVar1 = pbVar6 + 4;
            uVar2 = uVar7 - 3;
          }
        }
      }
    }
    fclose(__stream_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	snprintf(buff, sizeof(buff), "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			assert(VALID_UUDECODE(p[0]));
			assert(VALID_UUDECODE(p[1]));
			n = UUDECODE(*p++) << 18;
			n |= UUDECODE(*p++) << 12;
			fputc(n >> 16, out);
			--bytes;
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}